

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O2

void evaluation_compiletime<1l,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>>>
     ::
     apply<viennamath::ct_vector_3<viennamath::ct_constant<4l>,viennamath::ct_constant<6l>,viennamath::ct_constant<8l>>>
               (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>_>
                *e,ct_vector_3<viennamath::ct_constant<4L>,_viennamath::ct_constant<6L>,_viennamath::ct_constant<8L>_>
                   *v,double ref_solution)

{
  ostream *poVar1;
  double extraout_XMM0_Qa;
  double a;
  expr temp;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_20;
  double local_18;
  numeric_type local_10;
  
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x11;
  local_18 = ref_solution;
  std::ostream::_M_insert<double>(-11.0);
  local_10 = -11.0;
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_20,&local_10);
  std::operator<<((ostream *)&std::cout,"(should: ");
  poVar1 = std::ostream::_M_insert<double>(local_18);
  std::operator<<(poVar1,", is: ");
  (*(local_20._M_ptr)->_vptr_rt_expression_interface[6])(0x3ff0000000000000);
  poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  (*(local_20._M_ptr)->_vptr_rt_expression_interface[6])(0x3ff0000000000000);
  fuzzy_check(a,local_18);
  if (local_20._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_20._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  return;
}

Assistant:

static void apply(E const & e, VectorType const & v, double ref_solution)
  {
    std::cout.precision(17);
    std::cout << viennamath::eval(e, v);
    viennamath::expr temp(viennamath::eval(e, v));
    std::cout <<  "(should: " << ref_solution << ", is: " << temp(1.0) << ")" << std::endl;
    fuzzy_check(temp(1.0), ref_solution);
  }